

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphel.cpp
# Opt level: O0

void __thiscall
TPZGraphEl::DrawSolutionT<std::complex<double>>
          (TPZGraphEl *this,TPZGraphNode *n,TPZVec<int> *solind,TPZDrawStyle st)

{
  ostream *poVar1;
  int *piVar2;
  long *plVar3;
  int in_ECX;
  TPZVec<int> *in_RDX;
  TPZGraphNode *in_RSI;
  complex<double> *in_RDI;
  double solprint;
  int iv;
  int64_t is;
  int64_t ip;
  TPZManVector<std::complex<double>,_10> sol;
  TPZManVector<double,_4> x;
  TPZManVector<double,_4> qsi;
  int point;
  int np;
  int numvar;
  int64_t numsol;
  int imax;
  int res;
  TPZManVector<int,_3> co;
  int dim;
  int incr;
  int in;
  TPZManVector<std::complex<double>,_10> *in_stack_fffffffffffffd70;
  TPZGraphNode *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  double *in_stack_fffffffffffffd90;
  int64_t in_stack_fffffffffffffd98;
  TPZManVector<double,_4> *in_stack_fffffffffffffda0;
  undefined1 *size;
  TPZManVector<std::complex<double>,_10> *in_stack_fffffffffffffde0;
  double local_210;
  int local_204;
  long local_200;
  long local_1f8;
  complex<double> local_1f0;
  undefined1 local_1e0 [192];
  undefined8 local_120;
  undefined8 local_d8;
  undefined1 local_d0 [68];
  int local_8c;
  int local_88;
  int local_84;
  int64_t local_80;
  int local_74;
  int local_70;
  undefined4 local_5c;
  undefined1 local_58 [48];
  undefined4 local_28;
  undefined4 local_24;
  int local_20;
  int local_1c;
  TPZVec<int> *local_18;
  TPZGraphNode *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = ConnectNum((TPZGraphEl *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                        in_stack_fffffffffffffd80);
  local_28 = (**(code **)(*(long *)in_RDI->_M_value + 0x88))();
  local_5c = 0;
  size = local_58;
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (int *)in_stack_fffffffffffffd90);
  (**(code **)(*(long *)in_RDI->_M_value + 0xa0))(in_RDI,local_20,size,&local_24);
  local_70 = TPZGraphMesh::Res(*(TPZGraphMesh **)in_RDI[1]._M_value);
  local_80 = TPZVec<int>::NElements(local_18);
  local_74 = 1 << ((byte)local_70 & 0x1f);
  local_88 = (**(code **)(*(long *)in_RDI->_M_value + 0x70))(in_RDI,local_10);
  local_8c = 0;
  local_d8 = 0;
  TPZManVector<double,_4>::TPZManVector
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  local_120 = 0;
  TPZManVector<double,_4>::TPZManVector
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::complex<double>::complex(&local_1f0,0.0,0.0);
  TPZManVector<std::complex<double>,_10>::TPZManVector
            (in_stack_fffffffffffffde0,(int64_t)size,in_RDI);
  local_1f8 = TPZGraphNode::FirstPoint(local_10);
  for (; local_8c < local_88; local_8c = local_8c + 1) {
    (**(code **)(*(long *)in_RDI->_M_value + 0xb0))(in_RDI,local_58,local_74,local_d0);
    if ((local_1c == 1) || (local_1c == 2)) {
      poVar1 = TPZGraphMesh::Out(*(TPZGraphMesh **)in_RDI[1]._M_value);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1f8);
      std::operator<<(poVar1," ");
      local_1f8 = local_1f8 + 1;
    }
    for (local_200 = 0; local_200 < local_80; local_200 = local_200 + 1) {
      plVar3 = *(long **)(in_RDI->_M_value + 8);
      piVar2 = TPZVec<int>::operator[](local_18,local_200);
      (**(code **)(*plVar3 + 0x1b8))(plVar3,local_d0,*piVar2,local_1e0);
      plVar3 = (long *)(**(code **)(**(long **)(in_RDI->_M_value + 8) + 0xb8))();
      piVar2 = TPZVec<int>::operator[](local_18,local_200);
      local_84 = (**(code **)(*plVar3 + 0x88))(plVar3,*piVar2);
      if ((local_1c == 3) && (9 < local_84)) {
        local_84 = 9;
      }
      for (local_204 = 0; local_204 < local_84; local_204 = local_204 + 1) {
        local_210 = DrawSolutionT<std::complex<double>_>::anon_class_16_2_c964add4::operator()
                              ((anon_class_16_2_c964add4 *)0x1c86bf0);
        if (ABS(local_210) < 1e-20) {
          local_210 = 0.0;
        }
        poVar1 = TPZGraphMesh::Out(*(TPZGraphMesh **)in_RDI[1]._M_value);
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_210);
        std::operator<<(poVar1," ");
      }
      if (((local_1c == 1) || (local_1c == 2)) && (local_84 == 2)) {
        poVar1 = TPZGraphMesh::Out(*(TPZGraphMesh **)in_RDI[1]._M_value);
        in_stack_fffffffffffffd70 =
             (TPZManVector<std::complex<double>,_10> *)std::ostream::operator<<(poVar1,0.0);
        std::operator<<((ostream *)in_stack_fffffffffffffd70," ");
      }
      if ((local_1c == 3) && (local_84 != 1)) {
        for (; local_204 < 3; local_204 = local_204 + 1) {
          poVar1 = TPZGraphMesh::Out(*(TPZGraphMesh **)in_RDI[1]._M_value);
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,0.0);
          std::operator<<(poVar1," ");
        }
      }
    }
    poVar1 = TPZGraphMesh::Out(*(TPZGraphMesh **)in_RDI[1]._M_value);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    (**(code **)(*(long *)in_RDI->_M_value + 0xa8))(in_RDI,local_20,local_58,local_24);
  }
  TPZManVector<std::complex<double>,_10>::~TPZManVector(in_stack_fffffffffffffd70);
  TPZManVector<double,_4>::~TPZManVector((TPZManVector<double,_4> *)in_stack_fffffffffffffd70);
  TPZManVector<double,_4>::~TPZManVector((TPZManVector<double,_4> *)in_stack_fffffffffffffd70);
  TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffffd70);
  return;
}

Assistant:

void TPZGraphEl::DrawSolutionT(TPZGraphNode *n,TPZVec<int> &solind,TPZDrawStyle st)
{
	int in = ConnectNum(n);
	//int i,j,incr;
	int incr;
    int dim = Dimension();
	TPZManVector<int,3> co(dim,0);
	FirstIJ(in,co,incr);
	//	ComputeSequence(n, ibound, incr);
	int res = fGraphMesh->Res();
	int imax;
	int64_t numsol = solind.NElements();
	int numvar;
	imax = 1 << res;
	int np = NPoints(n);
	int point=0;
	TPZManVector<REAL,4> qsi(dim,0.),x(4,0.);
	TPZManVector<TVar,10> sol(6,0.);
	int64_t ip = n->FirstPoint();
	while(point < np) 
	{
		QsiEta(co,imax,qsi);
		if(st == EMVStyle || st == EV3DStyle) fGraphMesh->Out() << ip++ << " ";
		for(int64_t is=0; is<numsol; is++) 
		{
			fCompEl->Solution(qsi,solind[is],sol);
			numvar = fCompEl->Material()->NSolutionVariables(solind[is]);
			if(st == EVTKStyle)
			{
				if(numvar > 9) numvar = 9; // Because it 3x3 tensor variables
			}
			int iv;
			for(iv=0; iv<numvar;iv++)
			{
				auto solprint = [&sol,iv](){
					if constexpr (std::is_same_v<TVar, RTVar>) {
						return sol[iv];
					} else {
						return std::real(sol[iv]);
					}
				}();
				
				if (fabs(solprint) < 1.0e-20)
					{solprint = 0.0;}
				fGraphMesh->Out() << solprint << " ";
			}
			if ((st == EMVStyle || st == EV3DStyle) && numvar == 2)
				{fGraphMesh->Out() << 0. << " ";}
			if(st == EVTKStyle && numvar != 1){
				for(; iv<3; iv++) fGraphMesh->Out() << 0. << " ";
			}
		}
		fGraphMesh->Out() << endl;
		NextIJ(in,co,incr);
		point++;
	}
}